

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BReverbModel.cpp
# Opt level: O1

int __thiscall MT32Emu::BReverbModelImpl<short>::close(BReverbModelImpl<short> *this,int __fd)

{
  int in_EAX;
  int extraout_EAX;
  int extraout_EAX_00;
  BReverbSettings *pBVar1;
  BReverbSettings *pBVar2;
  
  if (this->allpasses != (AllpassFilter<short> **)0x0) {
    pBVar1 = this->currentSettings;
    if (pBVar1->numberOfAllpasses != 0) {
      pBVar2 = (BReverbSettings *)0x0;
      do {
        if (this->allpasses[(long)pBVar2] != (AllpassFilter<short> *)0x0) {
          (*(this->allpasses[(long)pBVar2]->super_RingBuffer<short>)._vptr_RingBuffer[1])();
          this->allpasses[(long)pBVar2] = (AllpassFilter<short> *)0x0;
        }
        pBVar2 = (BReverbSettings *)((long)&pBVar2->numberOfAllpasses + 1);
        pBVar1 = (BReverbSettings *)(ulong)this->currentSettings->numberOfAllpasses;
      } while (pBVar2 < pBVar1);
    }
    in_EAX = (int)pBVar1;
    if (this->allpasses != (AllpassFilter<short> **)0x0) {
      operator_delete__(this->allpasses);
      in_EAX = extraout_EAX;
    }
    this->allpasses = (AllpassFilter<short> **)0x0;
  }
  if (this->combs != (CombFilter<short> **)0x0) {
    pBVar1 = this->currentSettings;
    if (pBVar1->numberOfCombs != 0) {
      pBVar2 = (BReverbSettings *)0x0;
      do {
        if (this->combs[(long)pBVar2] != (CombFilter<short> *)0x0) {
          (*(this->combs[(long)pBVar2]->super_RingBuffer<short>)._vptr_RingBuffer[1])();
          this->combs[(long)pBVar2] = (CombFilter<short> *)0x0;
        }
        pBVar2 = (BReverbSettings *)((long)&pBVar2->numberOfAllpasses + 1);
        pBVar1 = (BReverbSettings *)(ulong)this->currentSettings->numberOfCombs;
      } while (pBVar2 < pBVar1);
    }
    in_EAX = (int)pBVar1;
    if (this->combs != (CombFilter<short> **)0x0) {
      operator_delete__(this->combs);
      in_EAX = extraout_EAX_00;
    }
    this->combs = (CombFilter<short> **)0x0;
  }
  return in_EAX;
}

Assistant:

void close() {
		if (allpasses != NULL) {
			for (Bit32u i = 0; i < currentSettings.numberOfAllpasses; i++) {
				if (allpasses[i] != NULL) {
					delete allpasses[i];
					allpasses[i] = NULL;
				}
			}
			delete[] allpasses;
			allpasses = NULL;
		}
		if (combs != NULL) {
			for (Bit32u i = 0; i < currentSettings.numberOfCombs; i++) {
				if (combs[i] != NULL) {
					delete combs[i];
					combs[i] = NULL;
				}
			}
			delete[] combs;
			combs = NULL;
		}
	}